

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O2

int nn_ipc_optset_getopt(nn_optset *self,int option,void *optval,size_t *optvallen)

{
  undefined4 uVar1;
  size_t sStack_8;
  
  if (option == 3) {
    uVar1 = *(undefined4 *)((long)&self[2].vfptr + 4);
  }
  else {
    if (option != 2) {
      if (option != 1) {
        return -0x5c;
      }
      *(nn_optset_vfptr **)optval = self[1].vfptr;
      sStack_8 = 8;
      goto LAB_001284c0;
    }
    uVar1 = *(undefined4 *)&self[2].vfptr;
  }
  *(undefined4 *)optval = uVar1;
  sStack_8 = 4;
LAB_001284c0:
  *optvallen = sStack_8;
  return 0;
}

Assistant:

static int nn_ipc_optset_getopt (struct nn_optset *self, int option,
    void *optval, size_t *optvallen)
{
    struct nn_ipc_optset *optset;

    optset = nn_cont (self, struct nn_ipc_optset, base);

    switch (option) {
    case NN_IPC_SEC_ATTR: 
        memcpy(optval, &optset->sec_attr, sizeof(optset->sec_attr));
        *optvallen = sizeof(optset->sec_attr);
        return 0;
    case NN_IPC_OUTBUFSZ:
        *(int *)optval = optset->outbuffersz;
        *optvallen = sizeof (int);
        return 0;
    case NN_IPC_INBUFSZ:
        *(int *)optval = optset->inbuffersz;
        *optvallen = sizeof (int);
        return 0;
    default:
        return -ENOPROTOOPT;
    }
}